

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::deinit
          (ConcurrentImageAtomicCase *this)

{
  code *pcVar1;
  ShaderProgram *pSVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  undefined4 extraout_var_00;
  reference pvVar6;
  int local_14;
  int ndx;
  ConcurrentImageAtomicCase *this_local;
  
  if (this->m_imageID != 0) {
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar4->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x480))(1,&this->m_imageID);
    this->m_imageID = 0;
  }
  local_14 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_intermediateResultBuffers);
    if ((int)sVar5 <= local_14) break;
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar3 = (*pRVar4->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_00,iVar3) + 0x438);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_intermediateResultBuffers,(long)local_14);
    (*pcVar1)(1,pvVar6);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            (&this->m_intermediateResultBuffers);
  pSVar2 = this->m_program;
  if (pSVar2 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar2);
    operator_delete(pSVar2,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  pSVar2 = this->m_imageReadProgram;
  if (pSVar2 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar2);
    operator_delete(pSVar2,0xd0);
  }
  this->m_imageReadProgram = (ShaderProgram *)0x0;
  pSVar2 = this->m_imageClearProgram;
  if (pSVar2 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar2);
    operator_delete(pSVar2,0xd0);
  }
  this->m_imageClearProgram = (ShaderProgram *)0x0;
  return;
}

Assistant:

void ConcurrentImageAtomicCase::deinit (void)
{
	if (m_imageID)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_imageID);
		m_imageID = 0;
	}

	for (int ndx = 0; ndx < (int)m_intermediateResultBuffers.size(); ++ndx)
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_intermediateResultBuffers[ndx]);
	m_intermediateResultBuffers.clear();

	delete m_program;
	m_program = DE_NULL;

	delete m_imageReadProgram;
	m_imageReadProgram = DE_NULL;

	delete m_imageClearProgram;
	m_imageClearProgram = DE_NULL;
}